

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O0

btree_result btree_prev(btree_iterator *it,void *key_buf,void *value_buf)

{
  btree_result bVar1;
  void *in_RDX;
  void *in_RSI;
  btree_iterator *in_RDI;
  btree_result br;
  
  bVar1 = _btree_prev(in_RDI,in_RSI,in_RDX,(in_RDI->btree).height - 1);
  if (bVar1 == BTREE_RESULT_SUCCESS) {
    in_RDI->flags = in_RDI->flags & 0xfc;
    in_RDI->flags = in_RDI->flags | 2;
  }
  else {
    in_RDI->flags = in_RDI->flags & 0xfc;
  }
  return bVar1;
}

Assistant:

btree_result btree_prev(struct btree_iterator *it, void *key_buf,
                        void *value_buf)
{
    btree_result br = _btree_prev(it, key_buf, value_buf, it->btree.height-1);
    if (br == BTREE_RESULT_SUCCESS) {
        BTREE_ITR_SET_REV(it);
    } else {
        BTREE_ITR_SET_NONE(it);
    }
    return br;
}